

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

bool CanonicalizePath(char *path,size_t *len,uint64_t *slash_bits,string *err)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  size_t sVar5;
  Metrics *this;
  int iVar6;
  char *pcVar7;
  Metric *pMVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  ScopedMetric metrics_h_scoped;
  char *components [60];
  ScopedMetric SStack_228;
  string local_218 [15];
  
  if ((CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)::metrics_h_metric
       == '\0') &&
     (iVar6 = __cxa_guard_acquire(&CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)
                                   ::metrics_h_metric), this = g_metrics, iVar6 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar8 = (Metric *)0x0;
    }
    else {
      local_218[0]._M_dataplus._M_p = (pointer)&local_218[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"canonicalize path","");
      pMVar8 = Metrics::NewMetric(this,local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218[0]._M_dataplus._M_p != &local_218[0].field_2) {
        operator_delete(local_218[0]._M_dataplus._M_p,local_218[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    CanonicalizePath::metrics_h_metric = pMVar8;
    __cxa_guard_release(&CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&SStack_228,CanonicalizePath::metrics_h_metric);
  sVar5 = *len;
  if (sVar5 == 0) {
    std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x123b02);
  }
  else {
    pcVar7 = path + (*path == '/');
    if ((long)(ulong)(*path == '/') < (long)sVar5) {
      pcVar3 = path + sVar5;
      uVar10 = 0;
      pcVar9 = pcVar7;
      do {
        lVar11 = 1;
        if (*pcVar9 == '/') {
LAB_0011ba06:
          pcVar9 = pcVar9 + lVar11;
        }
        else {
          iVar6 = (int)uVar10;
          if (*pcVar9 == '.') {
            pcVar1 = pcVar9 + 1;
            lVar11 = 2;
            if ((pcVar1 == pcVar3) || (*pcVar1 == '/')) goto LAB_0011ba06;
            if ((*pcVar1 != '.') || ((pcVar2 = pcVar9 + 2, pcVar2 != pcVar3 && (*pcVar2 != '/'))))
            goto LAB_0011ba35;
            if (iVar6 < 1) {
              *pcVar7 = '.';
              pcVar7[1] = *pcVar1;
              pcVar7[2] = *pcVar2;
              pcVar7 = pcVar7 + 3;
            }
            else {
              uVar10 = (ulong)(iVar6 - 1);
              pcVar7 = (&local_218[0]._M_dataplus)[uVar10]._M_p;
            }
            pcVar9 = pcVar9 + 3;
          }
          else {
LAB_0011ba35:
            if (iVar6 == 0x3c) {
              Fatal("path has too many components : %s",path);
            }
            (&local_218[0]._M_dataplus)[iVar6]._M_p = pcVar7;
            for (; (pcVar9 != pcVar3 && (*pcVar9 != '/')); pcVar9 = pcVar9 + 1) {
              *pcVar7 = *pcVar9;
              pcVar7 = pcVar7 + 1;
            }
            uVar10 = (ulong)(iVar6 + 1);
            cVar4 = *pcVar9;
            pcVar9 = pcVar9 + 1;
            *pcVar7 = cVar4;
            pcVar7 = pcVar7 + 1;
          }
        }
      } while (pcVar9 < pcVar3);
    }
    if (pcVar7 == path) {
      pcVar7[0] = '.';
      pcVar7[1] = '\0';
      pcVar7 = pcVar7 + 2;
    }
    *len = (size_t)(pcVar7 + ~(ulong)path);
    *slash_bits = 0;
  }
  ScopedMetric::~ScopedMetric(&SStack_228);
  return sVar5 != 0;
}

Assistant:

bool CanonicalizePath(char* path, size_t* len, uint64_t* slash_bits,
                      string* err) {
  // WARNING: this function is performance-critical; please benchmark
  // any changes you make to it.
  METRIC_RECORD("canonicalize path");
  if (*len == 0) {
    *err = "empty path";
    return false;
  }

  const int kMaxPathComponents = 60;
  char* components[kMaxPathComponents];
  int component_count = 0;

  char* start = path;
  char* dst = start;
  const char* src = start;
  const char* end = start + *len;

  if (IsPathSeparator(*src)) {
#ifdef _WIN32

    // network path starts with //
    if (*len > 1 && IsPathSeparator(*(src + 1))) {
      src += 2;
      dst += 2;
    } else {
      ++src;
      ++dst;
    }
#else
    ++src;
    ++dst;
#endif
  }

  while (src < end) {
    if (*src == '.') {
      if (src + 1 == end || IsPathSeparator(src[1])) {
        // '.' component; eliminate.
        src += 2;
        continue;
      } else if (src[1] == '.' && (src + 2 == end || IsPathSeparator(src[2]))) {
        // '..' component.  Back up if possible.
        if (component_count > 0) {
          dst = components[component_count - 1];
          src += 3;
          --component_count;
        } else {
          *dst++ = *src++;
          *dst++ = *src++;
          *dst++ = *src++;
        }
        continue;
      }
    }

    if (IsPathSeparator(*src)) {
      src++;
      continue;
    }

    if (component_count == kMaxPathComponents)
      Fatal("path has too many components : %s", path);
    components[component_count] = dst;
    ++component_count;

    while (src != end && !IsPathSeparator(*src))
      *dst++ = *src++;
    *dst++ = *src++;  // Copy '/' or final \0 character as well.
  }

  if (dst == start) {
    *dst++ = '.';
    *dst++ = '\0';
  }

  *len = dst - start - 1;
#ifdef _WIN32
  uint64_t bits = 0;
  uint64_t bits_mask = 1;

  for (char* c = start; c < start + *len; ++c) {
    switch (*c) {
      case '\\':
        bits |= bits_mask;
        *c = '/';
        NINJA_FALLTHROUGH;
      case '/':
        bits_mask <<= 1;
    }
  }

  *slash_bits = bits;
#else
  *slash_bits = 0;
#endif
  return true;
}